

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O1

void __thiscall
libDAI::FactorGraph::FactorGraph
          (FactorGraph *this,
          vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *P)

{
  pointer *ppVVar1;
  pointer *pppVar2;
  _Rb_tree_header *p_Var3;
  iterator __position;
  iterator __position_00;
  _Base_ptr p_Var4;
  pair<unsigned_long,_unsigned_long> pVar5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Iter in_R8;
  ulong uVar8;
  pointer pVVar9;
  _Self __tmp;
  ulong uVar10;
  pointer __x;
  undefined1 auVar11 [64];
  insert_iterator<std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>_>
  __result;
  VarSet ns;
  set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> _vars;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_98;
  pointer local_80;
  BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *local_78;
  pair<unsigned_long,_unsigned_long> local_70;
  _Rb_tree<libDAI::Var,_libDAI::Var,_std::_Identity<libDAI::Var>,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>
  local_60;
  
  (this->super_GraphicalModel)._normType = NORMPROB;
  (this->super_GraphicalModel)._vptr_GraphicalModel = (_func_int **)&PTR__FactorGraph_005e7dd8;
  p_Var3 = &(this->_backupFactors)._M_t._M_impl.super__Rb_tree_header;
  auVar11 = ZEXT1664(ZEXT816(0) << 0x40);
  *(undefined1 (*) [64])
   &(this->_fg)._nb2.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar11;
  (this->_fg)._V1 = (vector<libDAI::Var,_std::allocator<libDAI::Var>_>)auVar11._0_24_;
  (this->_fg)._V2 =
       (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)auVar11._24_24_;
  (this->_fg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar11._48_8_;
  (this->_fg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar11._56_8_;
  *(undefined1 (*) [64])
   &(this->_fg)._E12.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar11;
  (this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (P->super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>).
        _M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  if (__x != (P->
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                (&(this->_fg)._V2,__x);
      __result.iter._M_node = in_R8._M_node;
      __result.container =
           (set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *)
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<libDAI::Var_const*,std::insert_iterator<std::set<libDAI::Var,std::less<libDAI::Var>,std::allocator<libDAI::Var>>>>
                ((__copy_move<false,false,std::random_access_iterator_tag> *)
                 (__x->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (__x->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(Var *)&local_60,__result);
      __x = __x + 1;
    } while (__x != (P->
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var3;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    __position._M_current =
         (this->_fg)._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_fg)._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<libDAI::Var,std::allocator<libDAI::Var>>::_M_realloc_insert<libDAI::Var_const&>
                ((vector<libDAI::Var,std::allocator<libDAI::Var>> *)&this->_fg,__position,
                 (Var *)(p_Var7 + 1));
    }
    else {
      p_Var4 = p_Var7[1]._M_parent;
      (__position._M_current)->_label = *(long *)(p_Var7 + 1);
      (__position._M_current)->_states = (size_t)p_Var4;
      ppVVar1 = &(this->_fg)._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
  }
  uVar8 = 0;
  local_78 = &this->_fg;
  do {
    iVar6 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[9])(this);
    if (CONCAT44(extraout_var,iVar6) <= uVar8) {
      BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::Regenerate(local_78);
      std::
      _Rb_tree<libDAI::Var,_libDAI::Var,_std::_Identity<libDAI::Var>,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    iVar6 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[10])(this,uVar8);
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
              (&local_98,
               (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)CONCAT44(extraout_var_00,iVar6))
    ;
    local_80 = ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)CONCAT44(extraout_var_00,iVar6)
               )[1].super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_start;
    for (pVVar9 = local_98.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar9 != local_98.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_finish; pVVar9 = pVVar9 + 1) {
      for (uVar10 = 0; iVar6 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[5])(this),
          uVar10 < CONCAT44(extraout_var_01,iVar6); uVar10 = uVar10 + 1) {
        iVar6 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[6])(this,uVar10);
        if (*(long *)CONCAT44(extraout_var_02,iVar6) == pVVar9->_label) {
          __position_00._M_current =
               (this->_fg)._E12.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_70.first = uVar10;
          local_70.second = uVar8;
          if (__position_00._M_current ==
              (this->_fg)._E12.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&(this->_fg)._E12,__position_00,&local_70);
          }
          else {
            pVar5.second = uVar8;
            pVar5.first = uVar10;
            *__position_00._M_current = pVar5;
            pppVar2 = &(this->_fg)._E12.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
          }
          break;
        }
      }
    }
    if (local_98.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

FactorGraph::FactorGraph( const std::vector<Factor> &P ) : GraphicalModel(), _fg(), _backupFactors() {
        // add Factors
        set<Var> _vars;
        for(vector<Factor>::const_iterator p2 = P.begin(); p2 != P.end(); p2++ ) {
            _fg.V2s().push_back(*p2);
            copy( p2->vars().begin(), p2->vars().end(), inserter( _vars, _vars.begin() ) );
        }

        // add _vars
        for(set<Var>::const_iterator p1 = _vars.begin(); p1 != _vars.end(); p1++ )
            _fg.V1s().push_back(*p1);

        // create edges
        for(size_t i2 = 0; i2 < nrFactors(); i2++ ) {
            VarSet ns = factor(i2).vars();
            for(VarSet::const_iterator q = ns.begin(); q != ns.end(); q++ ) {
                for(size_t i1=0; i1 < nrVars(); i1++ ) {
                    if (var(i1) == *q) {
                        _fg.edges().push_back(edge_type(i1,i2));
                        break;
                    }
                }
            }
        }

        // calc neighbours and adjacency matrix
        Regenerate();
    }